

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

curl_off_t Curl_creader_client_length(Curl_easy *data)

{
  Curl_creader *pCVar1;
  curl_off_t cVar2;
  Curl_creader **ppCVar3;
  
  ppCVar3 = &(data->req).reader_stack;
  while( true ) {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Curl_creader *)0x0) {
      return -1;
    }
    if (pCVar1->phase == CURL_CR_CLIENT) break;
    ppCVar3 = &pCVar1->next;
  }
  cVar2 = (*pCVar1->crt->total_length)(data,pCVar1);
  return cVar2;
}

Assistant:

curl_off_t Curl_creader_client_length(struct Curl_easy *data)
{
  struct Curl_creader *r = data->req.reader_stack;
  while(r && r->phase != CURL_CR_CLIENT)
    r = r->next;
  return r ? r->crt->total_length(data, r) : -1;
}